

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O1

string * SoapySDRDeviceProbe_abi_cxx11_(string *__return_storage_ptr__,Device *device)

{
  char cVar1;
  byte bVar2;
  ostream *poVar3;
  size_t sVar4;
  size_t sVar5;
  size_t chan;
  char *pcVar6;
  string clockSources;
  string registers;
  string uarts;
  string gpios;
  string settings;
  string sensors;
  string timeSources;
  stringstream ss;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  undefined1 local_2a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  char local_270 [16];
  string *local_260;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  char local_228 [16];
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  char local_1e8 [16];
  undefined1 local_1d8 [32];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_260 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"-- Device identification",0x18);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  driver=",9);
  (**(code **)(*(long *)device + 0x10))(&local_2d0,device);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_2d0._M_impl._0_8_,
                      local_2d0._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((_Base_ptr *)local_2d0._M_impl._0_8_ !=
      &local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_2d0._M_impl._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  hardware=",0xb);
  (**(code **)(*(long *)device + 0x18))(&local_2d0,device);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_2d0._M_impl._0_8_,
                      local_2d0._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((_Base_ptr *)local_2d0._M_impl._0_8_ !=
      &local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_2d0._M_impl._0_8_);
  }
  (**(code **)(*(long *)device + 0x20))(&local_2d0,device);
  for (; (_Rb_tree_header *)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_2d0._M_impl.super__Rb_tree_header;
      local_2d0._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_2d0._M_impl.super__Rb_tree_header._M_header._M_left)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        *(char **)(local_2d0._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                        (long)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(local_2d0._M_impl.super__Rb_tree_header._M_header._M_left
                                         + 2),
                        (long)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left[2]._M_parent
                       );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2d0);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"-- Peripheral summary",0x15);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  sVar4 = (**(code **)(*(long *)device + 0x38))(device,1);
  sVar5 = (**(code **)(*(long *)device + 0x38))(device,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Channels: ",0xc);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Rx, ",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Tx",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Timestamps: ",0xe);
  local_2d0._M_impl._0_8_ = &local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  bVar2 = (**(code **)(*(long *)device + 0x298))(device,&local_2d0);
  pcVar6 = "NO";
  if (bVar2 != 0) {
    pcVar6 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,(ulong)bVar2 | 2);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((_Base_ptr *)local_2d0._M_impl._0_8_ !=
      &local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_2d0._M_impl._0_8_);
  }
  (**(code **)(*(long *)device + 0x268))(local_1d8,device);
  toString<std::__cxx11::string>
            ((string *)&local_2d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Clock sources: ",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_2d0._M_impl._0_8_,
                        local_2d0._M_impl.super__Rb_tree_header._M_header._0_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  (**(code **)(*(long *)device + 0x280))(&local_1f8,device);
  toString<std::__cxx11::string>
            ((string *)local_1d8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((pointer)local_1d8._8_8_ != (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Time sources: ",0x10)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1d8._0_8_,local_1d8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  (**(code **)(*(long *)device + 0x2b8))(local_2a0,device);
  toString<std::__cxx11::string>
            ((string *)&local_1f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a0);
  if (local_1f8._8_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Sensors: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f8._M_allocated_capacity,local_1f8._8_8_
                       );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  sensorReadings_abi_cxx11_((string *)local_2a0,device);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_2a0._0_8_,local_2a0._8_8_);
  if ((pointer)local_2a0._0_8_ != (pointer)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_);
  }
  (**(code **)(*(long *)device + 0x2e8))(local_218,device);
  toString<std::__cxx11::string>
            ((string *)local_2a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  if ((pointer)local_2a0._8_8_ != (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Registers: ",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_2a0._0_8_,local_2a0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  (**(code **)(*(long *)device + 800))(&local_238,device);
  toString_abi_cxx11_((string *)local_218,(ArgInfoList *)local_238._M_local_buf);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)local_238._M_local_buf
            );
  if ((pointer)local_218._8_8_ != (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Other Settings:",0x11);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)local_218._0_8_,local_218._8_8_);
  }
  (**(code **)(*(long *)device + 0x360))(local_258,device);
  toString<std::__cxx11::string>
            ((string *)&local_238,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  if (local_238._8_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  GPIOs: ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_238._M_allocated_capacity,local_238._8_8_
                       );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  (**(code **)(*(long *)device + 0x3b0))(&local_280,device);
  toString<std::__cxx11::string>
            ((string *)local_258,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_280);
  if ((pointer)local_258._8_8_ != (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  UARTs: ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_258._0_8_,local_258._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if (sVar4 != 0) {
    chan = 0;
    do {
      probeChannel_abi_cxx11_((string *)&local_280,device,1,chan);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_280._M_allocated_capacity,local_280._8_8_);
      if ((char *)local_280._M_allocated_capacity != local_270) {
        operator_delete((void *)local_280._M_allocated_capacity);
      }
      chan = chan + 1;
    } while (sVar4 != chan);
  }
  if (sVar5 != 0) {
    sVar4 = 0;
    do {
      probeChannel_abi_cxx11_((string *)&local_280,device,0,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_280._M_allocated_capacity,local_280._8_8_);
      if ((char *)local_280._M_allocated_capacity != local_270) {
        operator_delete((void *)local_280._M_allocated_capacity);
      }
      sVar4 = sVar4 + 1;
    } while (sVar5 != sVar4);
  }
  std::__cxx11::stringbuf::str();
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((char *)local_238._M_allocated_capacity != local_228) {
    operator_delete((void *)local_238._M_allocated_capacity);
  }
  if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_);
  }
  if ((pointer)local_2a0._0_8_ != (pointer)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_);
  }
  if ((char *)local_1f8._M_allocated_capacity != local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if ((_Base_ptr *)local_2d0._M_impl._0_8_ !=
      &local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_2d0._M_impl._0_8_);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_260;
}

Assistant:

std::string SoapySDRDeviceProbe(SoapySDR::Device *device)
{
    std::stringstream ss;

    /*******************************************************************
     * Identification info
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Device identification" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    ss << "  driver=" << device->getDriverKey() << std::endl;
    ss << "  hardware=" << device->getHardwareKey() << std::endl;
    for (const auto &it : device->getHardwareInfo())
    {
        ss << "  " << it.first << "=" << it.second << std::endl;
    }

    /*******************************************************************
     * Available peripherals
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Peripheral summary" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    size_t numRxChans = device->getNumChannels(SOAPY_SDR_RX);
    size_t numTxChans = device->getNumChannels(SOAPY_SDR_TX);
    ss << "  Channels: " << numRxChans << " Rx, " << numTxChans << " Tx" << std::endl;

    ss << "  Timestamps: " << (device->hasHardwareTime()?"YES":"NO") << std::endl;

    std::string clockSources = toString(device->listClockSources());
    if (not clockSources.empty()) ss << "  Clock sources: " << clockSources << std::endl;

    std::string timeSources = toString(device->listTimeSources());
    if (not timeSources.empty()) ss << "  Time sources: " << timeSources << std::endl;

    std::string sensors = toString(device->listSensors());
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;
    ss << sensorReadings(device);

    std::string registers = toString(device->listRegisterInterfaces());
    if (not registers.empty()) ss << "  Registers: " << registers << std::endl;

    std::string settings = toString(device->getSettingInfo());
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    std::string gpios = toString(device->listGPIOBanks());
    if (not gpios.empty()) ss << "  GPIOs: " << gpios << std::endl;

    std::string uarts = toString(device->listUARTs());
    if (not uarts.empty()) ss << "  UARTs: " << uarts << std::endl;

    /*******************************************************************
     * Per-channel info
     ******************************************************************/
    for (size_t chan = 0; chan < numRxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_RX, chan);
    }
    for (size_t chan = 0; chan < numTxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_TX, chan);
    }

    return ss.str();
}